

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_simplify_intsubadd_rightcancel(jit_State *J)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  TRef TVar3;
  IRRef1 IVar4;
  bool bVar5;
  
  TVar3 = 0;
  if ((((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) &&
     (TVar3 = 0, ((J->fold).right[0].field_1.t.irt & 0x40) == 0)) {
    IVar1 = (J->fold).ins.field_0.op1;
    IVar2 = (J->fold).right[0].field_0.op1;
    IVar4 = (J->fold).right[0].field_0.op2;
    if ((IVar1 == IVar2) || (bVar5 = IVar1 == IVar4, IVar4 = IVar2, TVar3 = 0, bVar5)) {
      (J->fold).ins.field_0.op2 = IVar4;
      TVar3 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      TVar3 = 1;
    }
  }
  return TVar3;
}

Assistant:

LJFOLD(SUB any ADD)
LJFOLDF(simplify_intsubadd_rightcancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fright);
    if (fins->op1 == fright->op1) {  /* i - (i + j) ==> 0 - j */
      fins->op2 = fright->op2;
      fins->op1 = (IRRef1)lj_ir_kint(J, 0);
      return RETRYFOLD;
    }
    if (fins->op1 == fright->op2) {  /* i - (j + i) ==> 0 - j */
      fins->op2 = fright->op1;
      fins->op1 = (IRRef1)lj_ir_kint(J, 0);
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}